

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O1

void spell_dark_vessel(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  OBJ_DATA *pOVar2;
  char *txt;
  CHAR_DATA *ch_local;
  OBJ_DATA *corpse;
  int local_184;
  void *local_180;
  void *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  for (pOVar2 = ch->carrying; pOVar2 != (OBJ_DATA *)0x0; pOVar2 = pOVar2->next_content) {
    if (pOVar2->item_type == 0x25) goto LAB_00306c46;
  }
  pOVar2 = (OBJ_DATA *)0x0;
LAB_00306c46:
  ch_local = ch;
  corpse = get_obj_here(ch,target_name);
  if ((pOVar2 == (OBJ_DATA *)0x0) || (pOVar2->value[3] < (int)corpse->level)) {
    if ((corpse == (OBJ_DATA *)0x0) || (bVar1 = str_cmp(target_name,""), !bVar1)) {
      txt = "You fail to select a corpse and waste your dark energies.\n\r";
    }
    else if (((ushort)((short)*(undefined4 *)&corpse->item_type - 0x17U) < 2) &&
            ((corpse->wear_flags[0] & 0x8000000) == 0)) {
      if (ch_local->level + -9 <= (int)corpse->level) {
        obj = pOVar2;
        if (pOVar2 == (OBJ_DATA *)0x0) {
          pObjIndex = get_obj_index(0);
          obj = create_object(pObjIndex,0);
          if (obj == (OBJ_DATA *)0x0) {
            return;
          }
        }
        obj->level = ch_local->level;
        obj->value[3] = (int)corpse->level;
        if (pOVar2 == (OBJ_DATA *)0x0) {
          obj->value[4] = 0;
          obj_to_char(obj,ch_local);
        }
        corpse->wear_flags[1] = corpse->wear_flags[1] | 1;
        *(byte *)corpse->wear_flags = (byte)corpse->wear_flags[0] & 0xfe;
        WAIT_STATE(ch_local,0x18);
        act("$n plunges a hand into $p\'s chest cavity, and removes the heart.",ch_local,corpse,
            (void *)0x0,0);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"spell_dark_vessel","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"act_queue","");
        local_180 = (void *)0x0;
        local_178 = (void *)0x0;
        local_184 = 0;
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[57],char_data*&,decltype(nullptr),decltype(nullptr),int>
                  (&RS.Queue,2,&local_50,&local_f0,act_queue,
                   (char (*) [57])"$n holds the heart aloft as it visibly begins to harden.",
                   &ch_local,&local_180,&local_178,&local_184);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        send_to_char("You remove the corpse\'s heart and squeeze the blood out of it, hardening it into a solid object.\n\r"
                     ,ch_local);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"spell_dark_vessel","");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"make_urn","");
        CQueue::AddToQueue<void(*)(char_data*,obj_data*),char_data*&,obj_data*&>
                  (&RS.Queue,4,&local_70,&local_110,make_urn,&ch_local,&corpse);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (pOVar2 != (OBJ_DATA *)0x0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"spell_dark_vessel","");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"send_to_char_queue","");
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[173],char_data*&>
                    (&RS.Queue,6,&local_90,&local_130,send_to_char_queue,
                     (char (*) [173])
                     "You drink the remaining blood from your old vessel, expelling each drop into the new one as your body convulses!\n\r The old vessel drops from your hand as it turns to ash.\n\r"
                     ,&ch_local);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"spell_dark_vessel","");
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"act_queue","");
          local_180 = (void *)0x0;
          local_178 = (void *)0x0;
          local_184 = 0;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[121],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (&RS.Queue,7,&local_b0,&local_150,act_queue,
                     (char (*) [121])
                     "$n drinks a thick fluid from a sanguine object and begins convulsing as they expel the fluid into the newly made vessel!"
                     ,&ch_local,&local_180,&local_178,&local_184);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"spell_dark_vessel","");
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"act_queue","");
          local_180 = (void *)0x0;
          local_178 = (void *)0x0;
          local_184 = 0;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[63],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (&RS.Queue,8,&local_d0,&local_170,act_queue,
                     (char (*) [63])"$n shudders, releasing the sanguine object as it turns to ash."
                     ,&ch_local,&local_180,&local_178,&local_184);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        return;
      }
      txt = "That corpse isn\'t powerful enough to contain your dark energies.\n\r";
    }
    else {
      txt = "That wouldn\'t be a suitable dark vessel.\n\r";
    }
  }
  else {
    txt = "You already have a dark vessel in your possession.\n\r";
  }
  send_to_char(txt,ch_local);
  return;
}

Assistant:

void spell_dark_vessel(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *urn, *corpse;

	urn = find_urn(ch);
	corpse = get_obj_here(ch, target_name);
	
	if (urn != nullptr && urn->value[3] >= corpse->level)
	{
		send_to_char("You already have a dark vessel in your possession.\n\r", ch);
		return;	
	}


	if (!corpse || !str_cmp(target_name, ""))
	{
		send_to_char("You fail to select a corpse and waste your dark energies.\n\r", ch);
		return;
	}

	if ((corpse->item_type != ITEM_CORPSE_PC && corpse->item_type != ITEM_CORPSE_NPC)
		|| IS_SET(corpse->wear_flags, CORPSE_NO_ANIMATE))
	{
		send_to_char("That wouldn't be a suitable dark vessel.\n\r", ch);
		return;
	}

	if (corpse->level < (ch->level - 9))
	{
		send_to_char("That corpse isn't powerful enough to contain your dark energies.\n\r", ch);
		return;
	}

	bool isNewUrn = false;
	if(urn == nullptr)
	{
		urn = create_object(get_obj_index(OBJ_VNUM_URN), 0);
		if (!urn) // something went wrong, stop the creation
			return;
		
		isNewUrn = true;
	}


	urn->level = ch->level;
	urn->value[3] = corpse->level;

	if(isNewUrn)
	{
		urn->value[4] = 0;
		obj_to_char(urn, ch);
	}

	SET_BIT(corpse->wear_flags, ITEM_NO_SAC);
	REMOVE_BIT(corpse->wear_flags, ITEM_TAKE);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);

	act("$n plunges a hand into $p's chest cavity, and removes the heart.", ch, corpse, 0, TO_ROOM);

	RS.Queue.AddToQueue(2, "spell_dark_vessel", "act_queue", act_queue, "$n holds the heart aloft as it visibly begins to harden.", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You remove the corpse's heart and squeeze the blood out of it, hardening it into a solid object.\n\r", ch);

	RS.Queue.AddToQueue(4, "spell_dark_vessel", "make_urn", make_urn, ch, corpse);
	
	if(isNewUrn == false)
	{
		RS.Queue.AddToQueue(6, "spell_dark_vessel", "send_to_char_queue", send_to_char_queue, "You drink the remaining blood from your old vessel, expelling each drop into the new one as your body convulses!\n\r The old vessel drops from your hand as it turns to ash.\n\r", ch);
		RS.Queue.AddToQueue(7, "spell_dark_vessel", "act_queue", act_queue, "$n drinks a thick fluid from a sanguine object and begins convulsing as they expel the fluid into the newly made vessel!", ch, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(8, "spell_dark_vessel", "act_queue", act_queue, "$n shudders, releasing the sanguine object as it turns to ash.", ch, nullptr, nullptr, TO_ROOM);
	}
}